

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O2

LoadResult * __thiscall
slang::driver::SourceLoader::loadAndParse
          (LoadResult *__return_storage_ptr__,SourceLoader *this,FileEntry *entry,Bag *optionBag,
          SourceOptions *srcOptions,uint64_t fileSortKey)

{
  UnitEntry *pUVar1;
  undefined8 uVar2;
  BufferOrError buffer;
  shared_ptr<slang::syntax::SyntaxTree> tree;
  anon_union_32_2_293c120a_for_storage_t_impl<slang::SourceBuffer,_std::error_code>_2 local_88;
  char local_68;
  undefined1 local_58 [32];
  bool local_38;
  
  local_68 = '\x01';
  local_88.m_value.data._M_len = 0;
  local_88.m_value.data._M_str = (char *)0x0;
  local_88.m_value.library = (SourceLibrary *)0x0;
  local_88._24_8_ = 0;
  if ((entry->preloadedBuffer).id.id == 0) {
    SourceManager::readSource
              ((BufferOrError *)local_58,this->sourceManager,&entry->path,entry->library,fileSortKey
              );
  }
  else {
    local_38 = true;
    local_58._0_8_ = (entry->preloadedBuffer).data._M_len;
    local_58._8_8_ = (entry->preloadedBuffer).data._M_str;
    local_58._16_8_ = (entry->preloadedBuffer).library;
    local_58._24_8_ = *(undefined8 *)&(entry->preloadedBuffer).id;
  }
  nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator=
            ((expected<slang::SourceBuffer,_std::error_code> *)&local_88.m_value,
             (expected<slang::SourceBuffer,_std::error_code> *)local_58);
  if (local_68 == '\0') {
    *(size_t *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             ).
             super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             ._M_u + 8) = local_88.m_value.data._M_len;
    *(char **)((long)&(__return_storage_ptr__->
                      super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      ).
                      super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      ._M_u + 0x10) = local_88.m_value.data._M_str;
    *(FileEntry **)
     &(__return_storage_ptr__->
      super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ).
      super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ._M_u = entry;
    (__return_storage_ptr__->
    super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    ).
    super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    ._M_index = '\x02';
  }
  else {
    pUVar1 = entry->unit;
    if (pUVar1 == (UnitEntry *)0x0) {
      if ((entry->isLibraryFile == false) && (srcOptions->singleUnit == true)) {
        *(SourceLibrary **)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x10) = local_88.m_value.library;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x18) = local_88._24_8_;
        *(size_t *)
         &(__return_storage_ptr__->
          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ).
          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ._M_u = local_88.m_value.data._M_len;
        *(char **)((long)&(__return_storage_ptr__->
                          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ).
                          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ._M_u + 8) = local_88.m_value.data._M_str;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x20) = 0;
        (__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_index = '\x01';
      }
      else if (srcOptions->librariesInheritMacros == true) {
        *(SourceLibrary **)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x10) = local_88.m_value.library;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x18) = local_88._24_8_;
        *(size_t *)
         &(__return_storage_ptr__->
          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ).
          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ._M_u = local_88.m_value.data._M_len;
        *(char **)((long)&(__return_storage_ptr__->
                          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ).
                          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ._M_u + 8) = local_88.m_value.data._M_str;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x20) = 1;
        (__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_index = '\x01';
      }
      else {
        slang::syntax::SyntaxTree::fromBuffer
                  ((SyntaxTree *)local_58,&local_88.m_value,this->sourceManager,optionBag,
                   (MacroList)ZEXT816(0));
        uVar2 = local_58._8_8_;
        if ((entry->isLibraryFile != false) || (srcOptions->onlyLint != false)) {
          *(undefined1 *)local_58._0_8_ = 1;
        }
        *(undefined8 *)
         &(__return_storage_ptr__->
          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ).
          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ._M_u = local_58._0_8_;
        local_58._8_8_ = (char *)0x0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 8) = uVar2;
        local_58._0_8_ = 0;
        (__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_index = '\0';
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      }
    }
    else {
      *(SourceLibrary **)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ).
               super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ._M_u + 0x10) = local_88.m_value.library;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ).
               super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ._M_u + 0x18) = local_88._24_8_;
      *(size_t *)
       &(__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_u = local_88.m_value.data._M_len;
      *(char **)((long)&(__return_storage_ptr__->
                        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        ).
                        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        ._M_u + 8) = local_88.m_value.data._M_str;
      *(UnitEntry **)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ).
               super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ._M_u + 0x20) = pUVar1;
      (__return_storage_ptr__->
      super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ).
      super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ._M_index = '\x03';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SourceLoader::LoadResult SourceLoader::loadAndParse(const FileEntry& entry, const Bag& optionBag,
                                                    const SourceOptions& srcOptions,
                                                    uint64_t fileSortKey) {
    // TODO: error if secondLib is set

    SourceManager::BufferOrError buffer;
    if (entry.preloadedBuffer)
        buffer = entry.preloadedBuffer;
    else
        buffer = sourceManager.readSource(entry.path, entry.library, fileSortKey);

    if (!buffer)
        return std::pair{&entry, buffer.error()};

    if (entry.unit) {
        return std::pair{*buffer, entry.unit};
    }
    else if (!entry.isLibraryFile && srcOptions.singleUnit) {
        // If this file was directly specified (i.e. not via
        // a library mapping) and we're in single-unit mode,
        // collect it for later parsing.
        return std::pair{*buffer, false};
    }
    else if (srcOptions.librariesInheritMacros) {
        // If libraries inherit macros then we can't parse here,
        // we need to wait for the main compilation unit to be parsed.
        SLANG_ASSERT(entry.isLibraryFile);
        return std::pair{*buffer, true};
    }
    else {
        // Otherwise we can parse right away.
        auto tree = SyntaxTree::fromBuffer(*buffer, sourceManager, optionBag);
        if (entry.isLibraryFile || srcOptions.onlyLint)
            tree->isLibraryUnit = true;

        return tree;
    }
}